

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake25519.cc
# Opt level: O2

int SPAKE2_process_msg(SPAKE2_CTX *ctx,uint8_t *out_key,size_t *out_key_len,size_t max_out_key_len,
                      uint8_t *their_msg,size_t their_msg_len)

{
  int iVar1;
  uint8_t *precomp_table;
  size_t __n;
  uint8_t dh_shared_encoded [32];
  uint8_t key [64];
  SHA512_CTX sha;
  ge_p3 Qstar;
  ge_p2 dh_shared;
  ge_p3 Q_ext;
  ge_p1p1 Q_compl;
  ge_cached peers_mask_cached;
  ge_p3 peers_mask;
  
  iVar1 = 0;
  if ((their_msg_len == 0x20) && (ctx->state == spake2_state_msg_generated)) {
    iVar1 = x25519_ge_frombytes_vartime(&Qstar,their_msg);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      precomp_table = kSpakeMSmallPrecomp;
      if (ctx->my_role == spake2_role_alice) {
        precomp_table = kSpakeNSmallPrecomp;
      }
      x25519_ge_scalarmult_small_precomp(&peers_mask,ctx->password_scalar,precomp_table);
      x25519_ge_p3_to_cached(&peers_mask_cached,&peers_mask);
      x25519_ge_sub(&Q_compl,&Qstar,&peers_mask_cached);
      x25519_ge_p1p1_to_p3(&Q_ext,&Q_compl);
      x25519_ge_scalarmult(&dh_shared,ctx->private_key,&Q_ext);
      x25519_ge_tobytes(dh_shared_encoded,&dh_shared);
      SHA512_Init((SHA512_CTX *)&sha);
      if (ctx->my_role == spake2_role_alice) {
        update_with_length_prefix(&sha,ctx->my_name,ctx->my_name_len);
        update_with_length_prefix(&sha,ctx->their_name,ctx->their_name_len);
        update_with_length_prefix(&sha,ctx->my_msg,0x20);
      }
      else {
        update_with_length_prefix(&sha,ctx->their_name,ctx->their_name_len);
        update_with_length_prefix(&sha,ctx->my_name,ctx->my_name_len);
        update_with_length_prefix(&sha,their_msg,0x20);
        their_msg = ctx->my_msg;
      }
      update_with_length_prefix(&sha,their_msg,0x20);
      update_with_length_prefix(&sha,dh_shared_encoded,0x20);
      update_with_length_prefix(&sha,ctx->password_hash,0x40);
      SHA512_Final(key,(SHA512_CTX *)&sha);
      __n = 0x40;
      if (max_out_key_len < 0x40) {
        __n = max_out_key_len;
      }
      if (max_out_key_len != 0) {
        memcpy(out_key,key,__n);
      }
      *out_key_len = __n;
      ctx->state = spake2_state_key_generated;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int SPAKE2_process_msg(SPAKE2_CTX *ctx, uint8_t *out_key, size_t *out_key_len,
                       size_t max_out_key_len, const uint8_t *their_msg,
                       size_t their_msg_len) {
  if (ctx->state != spake2_state_msg_generated || their_msg_len != 32) {
    return 0;
  }

  ge_p3 Qstar;
  if (!x25519_ge_frombytes_vartime(&Qstar, their_msg)) {
    // Point received from peer was not on the curve.
    return 0;
  }

  // Unmask peer's value.
  ge_p3 peers_mask;
  x25519_ge_scalarmult_small_precomp(&peers_mask, ctx->password_scalar,
                                     ctx->my_role == spake2_role_alice
                                         ? kSpakeNSmallPrecomp
                                         : kSpakeMSmallPrecomp);

  ge_cached peers_mask_cached;
  x25519_ge_p3_to_cached(&peers_mask_cached, &peers_mask);

  ge_p1p1 Q_compl;
  ge_p3 Q_ext;
  x25519_ge_sub(&Q_compl, &Qstar, &peers_mask_cached);
  x25519_ge_p1p1_to_p3(&Q_ext, &Q_compl);

  ge_p2 dh_shared;
  x25519_ge_scalarmult(&dh_shared, ctx->private_key, &Q_ext);

  uint8_t dh_shared_encoded[32];
  x25519_ge_tobytes(dh_shared_encoded, &dh_shared);

  SHA512_CTX sha;
  SHA512_Init(&sha);
  if (ctx->my_role == spake2_role_alice) {
    update_with_length_prefix(&sha, ctx->my_name, ctx->my_name_len);
    update_with_length_prefix(&sha, ctx->their_name, ctx->their_name_len);
    update_with_length_prefix(&sha, ctx->my_msg, sizeof(ctx->my_msg));
    update_with_length_prefix(&sha, their_msg, 32);
  } else {
    update_with_length_prefix(&sha, ctx->their_name, ctx->their_name_len);
    update_with_length_prefix(&sha, ctx->my_name, ctx->my_name_len);
    update_with_length_prefix(&sha, their_msg, 32);
    update_with_length_prefix(&sha, ctx->my_msg, sizeof(ctx->my_msg));
  }
  update_with_length_prefix(&sha, dh_shared_encoded, sizeof(dh_shared_encoded));
  update_with_length_prefix(&sha, ctx->password_hash,
                            sizeof(ctx->password_hash));

  uint8_t key[SHA512_DIGEST_LENGTH];
  SHA512_Final(key, &sha);

  size_t to_copy = max_out_key_len;
  if (to_copy > sizeof(key)) {
    to_copy = sizeof(key);
  }
  OPENSSL_memcpy(out_key, key, to_copy);
  *out_key_len = to_copy;
  ctx->state = spake2_state_key_generated;

  return 1;
}